

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Messages.hpp
# Opt level: O0

string_view __thiscall webfront::msg::FunctionCall::typeName<char[12]>(FunctionCall *this)

{
  string_view sVar1;
  size_type sVar2;
  string_view suffix;
  string_view prefix;
  string_view tName;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30 [3];
  
  this_00 = local_30;
  http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffb0,(char *)this_00);
  http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffb0,(char *)this_00);
  http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffb0,(char *)this_00);
  sVar2 = http::std::basic_string_view<char,_std::char_traits<char>_>::size(&local_40);
  http::std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(this_00,sVar2);
  sVar2 = http::std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffb0);
  http::std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix(this_00,sVar2);
  sVar1._M_str = local_30[0]._M_str;
  sVar1._M_len = local_30[0]._M_len;
  return sVar1;
}

Assistant:

constexpr auto typeName() {
#if defined(_MSC_VER)
        std::string_view tName = __FUNCSIG__, prefix = "auto __cdecl JSFunction::typeName<", suffix = ">(void)";
#elif __clang__
        std::string_view tName = __PRETTY_FUNCTION__, prefix = "auto webfront::JSFunction::typeName() [T = ", suffix = "]";
#elif defined(__GNUC__)
        std::string_view tName = __PRETTY_FUNCTION__,
                         prefix = "constexpr auto webfront::JSFunction::typeName() [with T = ", suffix = "]";
#endif
        tName.remove_prefix(prefix.size());
        tName.remove_suffix(suffix.size());
        return tName;
    }